

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O2

void __thiscall Search::BaseTask::Run(BaseTask *this)

{
  bool bVar1;
  search_private *psVar2;
  stringstream *psVar3;
  byte bVar4;
  allocator local_51;
  float local_50;
  float local_4c;
  string local_48 [32];
  
  psVar2 = this->sch->priv;
  bVar1 = psVar2->should_produce_string;
  bVar4 = bVar1;
  if ((this->_final_run == false) &&
     (this->_with_output_string == (_func_void_search_ptr_stringstream_ptr *)0x0)) {
    psVar2->should_produce_string = false;
    bVar4 = 0;
  }
  local_4c = psVar2->test_loss;
  psVar2->learn_loss = psVar2->learn_loss * 0.5;
  local_50 = psVar2->train_loss;
  if (bVar4 != 0) {
    psVar3 = psVar2->pred_string;
    std::__cxx11::string::string(local_48,"",&local_51);
    std::__cxx11::stringbuf::str((string *)(psVar3 + 0x18));
    std::__cxx11::string::~string(local_48);
  }
  psVar2->t = 0;
  psVar2->metaoverride = this;
  (*psVar2->task->run)(this->sch,this->ec);
  psVar2->metaoverride = (BaseTask *)0x0;
  psVar2->meta_t = psVar2->meta_t + psVar2->t;
  if ((this->_with_output_string != (_func_void_search_ptr_stringstream_ptr *)0x0 & bVar1) == 1) {
    (*this->_with_output_string)(this->sch,psVar2->pred_string);
  }
  psVar2->should_produce_string = bVar1;
  if (this->_final_run == false) {
    psVar2->test_loss = local_4c;
    psVar2->train_loss = local_50;
  }
  return;
}

Assistant:

void BaseTask::Run()
{
  search_private& priv = *sch->priv;
  // make sure output is correct
  bool old_should_produce_string = priv.should_produce_string;
  if (!_final_run && !_with_output_string)
    priv.should_produce_string = false;
  // if this isn't a final run, it shouldn't count for loss
  float old_test_loss = priv.test_loss;
  // float old_learn_loss = priv.learn_loss;
  priv.learn_loss *= 0.5;
  float old_train_loss = priv.train_loss;

  if (priv.should_produce_string)
    priv.pred_string->str("");

  priv.t = 0;
  priv.metaoverride = this;
  priv.task->run(*sch, ec);
  priv.metaoverride = nullptr;
  priv.meta_t += priv.t;

  // restore
  if (_with_output_string && old_should_produce_string)
    _with_output_string(*sch, *priv.pred_string);

  priv.should_produce_string = old_should_produce_string;
  if (!_final_run)
  {
    priv.test_loss = old_test_loss;
    // priv.learn_loss = old_learn_loss;
    priv.train_loss = old_train_loss;
  }
}